

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_mon_spell_power_cutoff(parser *p)

{
  long *plVar1;
  wchar_t wVar2;
  parser_error pVar3;
  void *pvVar4;
  void *pvVar5;
  long *plVar6;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pvVar5 = mem_zalloc(0x40);
    wVar2 = parser_getint(p,"power");
    *(wchar_t *)((long)pvVar5 + 8) = wVar2;
    plVar1 = *(long **)((long)pvVar4 + 0x20);
    do {
      plVar6 = plVar1;
      plVar1 = (long *)*plVar6;
    } while (plVar1 != (long *)0x0);
    *plVar6 = (long)pvVar5;
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_mon_spell_power_cutoff(struct parser *p) {
	struct monster_spell *s = parser_priv(p);
	struct monster_spell_level *l, *new;

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	new = mem_zalloc(sizeof(*new));
	new->power = parser_getint(p, "power");
	l = s->level;
	while (l->next) {
		l = l->next;
	}
	l->next = new;
	return PARSE_ERROR_NONE;
}